

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Parser * GetParserForNode(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Lexer *lexer;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((int)(doc->config).value[0x67].v == 0) {
    if ((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) {
      doc_local = (TidyDocImpl *)0x0;
    }
    else {
      if ((node->tag->model & 1) == 0) {
        if ((node->tag->model & 0x10) == 0) {
          pLVar1->insertspace = no;
        }
      }
      else {
        pLVar1->waswhite = no;
        if (node->tag->parser == (Parser *)0x0) {
          return (Parser *)0x0;
        }
      }
      if (node->tag->parser == (Parser *)0x0) {
        doc_local = (TidyDocImpl *)0x0;
      }
      else if (node->type == StartEndTag) {
        doc_local = (TidyDocImpl *)0x0;
      }
      else {
        pLVar1->parent = node;
        doc_local = (TidyDocImpl *)node->tag->parser;
      }
    }
  }
  else {
    doc_local = (TidyDocImpl *)ParseXMLElement;
  }
  return (Parser *)doc_local;
}

Assistant:

static Parser* GetParserForNode( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( cfgBool( doc, TidyXmlTags ) )
        return ParseXMLElement;
    
    /* [i_a]2 prevent crash for active content (php, asp) docs */
    if (!node || node->tag == NULL)
        return NULL;

    /*
       Fix by GLP 2000-12-21.  Need to reset insertspace if this is both
       a non-inline and empty tag (base, link, meta, isindex, hr, area).
    */
    if (node->tag->model & CM_EMPTY)
    {
        lexer->waswhite = no;
        if (node->tag->parser == NULL)
            return NULL;
    }
    else if (!(node->tag->model & CM_INLINE))
        lexer->insertspace = no;

    if (node->tag->parser == NULL)
        return NULL;

    if (node->type == StartEndTag)
        return NULL;

    /* [i_a]2 added this - not sure why - CHECKME: */
    lexer->parent = node;

    return (node->tag->parser);
}